

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool IsGoodConstantArray(ExpressionContext *ctx,VmModule *module,VmInstruction *instInit)

{
  uint uVar1;
  VmValueType VVar2;
  bool bVar3;
  VmValue **ppVVar4;
  uint i;
  uint index;
  uint index_00;
  SmallArray<VmValue_*,_4U> *this;
  VmInstruction *instInit_00;
  
  if (instInit->cmd != VM_INST_ARRAY) {
    __assert_fail("instInit->cmd == VM_INST_ARRAY",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xc34,
                  "bool IsGoodConstantArray(ExpressionContext &, VmModule *, VmInstruction *)");
  }
  for (index = 0; uVar1 = (instInit->arguments).count, index < uVar1; index = index + 1) {
    ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&instInit->arguments,index);
    instInit_00 = (VmInstruction *)*ppVVar4;
    if (instInit_00 == (VmInstruction *)0x0) break;
    if ((instInit_00->super_VmValue).typeID == 2) {
      if (instInit_00->cmd != VM_INST_ARRAY) {
        if (instInit_00->cmd == VM_INST_DOUBLE_TO_FLOAT) {
          this = &instInit_00->arguments;
          index_00 = 0;
        }
        else {
          RunConstantPropagation(ctx,module,(VmValue *)instInit_00,true);
          this = &instInit->arguments;
          index_00 = index;
        }
        ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,index_00);
        instInit_00 = (VmInstruction *)*ppVVar4;
        if (instInit_00 != (VmInstruction *)0x0) goto LAB_0024eba1;
        break;
      }
      bVar3 = IsGoodConstantArray(ctx,module,instInit_00);
      if (!bVar3) goto LAB_0024eba1;
    }
    else {
LAB_0024eba1:
      if ((((instInit_00->super_VmValue).typeID != 1) ||
          (*(char *)((long)&(instInit_00->arguments).allocator + 1) != '\0')) ||
         ((VVar2 = (instInit_00->super_VmValue).type.type, 2 < VVar2 - VM_TYPE_INT &&
          ((VVar2 != VM_TYPE_STRUCT || ((instInit_00->arguments).little[0] == (VmValue *)0x0))))))
      break;
    }
  }
  return uVar1 <= index;
}

Assistant:

bool IsGoodConstantArray(ExpressionContext &ctx, VmModule *module, VmInstruction *instInit)
{
	assert(instInit->cmd == VM_INST_ARRAY);

	for(unsigned i = 0; i < instInit->arguments.size(); i++)
	{
		VmValue *elementValue = instInit->arguments[i];

		if(VmInstruction *elementInst = getType<VmInstruction>(elementValue))
		{
			if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
			{
				elementValue = elementInst->arguments[0];
			}
			else if(elementInst->cmd == VM_INST_ARRAY)
			{
				if(IsGoodConstantArray(ctx, module, elementInst))
					continue;
			}
			else
			{
				RunConstantPropagation(ctx, module, elementInst, true);
				elementValue = instInit->arguments[i];
			}
		}

		VmConstant *element = getType<VmConstant>(elementValue);

		if(!element || element->isReference)
			return false;

		if(element->type.type == VM_TYPE_INT)
			continue;
		else if(element->type.type == VM_TYPE_DOUBLE)
			continue;
		else if(element->type.type == VM_TYPE_LONG)
			continue;
		else if(element->type.type == VM_TYPE_STRUCT && element->sValue)
			continue;

		return false;
	}

	return true;
}